

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void connectDebugSignals(shared_ptr<gui::MenuBar> *menuBar,string *name)

{
  string *name_00;
  shared_ptr<gui::MenuBar> local_20;
  
  name_00 = (string *)menuBar;
  std::dynamic_pointer_cast<gui::Widget,gui::MenuBar>(&local_20);
  connectDebugSignals((shared_ptr<gui::Widget> *)&local_20,name_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super___shared_ptr<gui::MenuBar,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  gui::Signal<gui::Widget*,sf::Mouse::Button,sf::Vector2<float>const&>::
  connect<void(&)(gui::Widget*,sf::Mouse::Button,sf::Vector2<float>const&)>
            ((Signal<gui::Widget*,sf::Mouse::Button,sf::Vector2<float>const&> *)
             &((menuBar->super___shared_ptr<gui::MenuBar,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              onMousePress,mousePress);
  gui::Signal<gui::Widget*,sf::Mouse::Button,sf::Vector2<float>const&>::
  connect<void(&)(gui::Widget*,sf::Mouse::Button,sf::Vector2<float>const&)>
            ((Signal<gui::Widget*,sf::Mouse::Button,sf::Vector2<float>const&> *)
             &((menuBar->super___shared_ptr<gui::MenuBar,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              onMouseRelease,mouseRelease);
  gui::Signal<gui::Widget*,sf::Vector2<float>const&>::
  connect<void(&)(gui::Widget*,sf::Vector2<float>const&)>
            ((Signal<gui::Widget*,sf::Vector2<float>const&> *)
             &((menuBar->super___shared_ptr<gui::MenuBar,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              onClick,click);
  gui::Signal<gui::Widget*,gui::MenuList_const&,unsigned_long>::
  connect<void(&)(gui::Widget*,gui::MenuList_const&,unsigned_long)>
            ((Signal<gui::Widget*,gui::MenuList_const&,unsigned_long> *)
             &((menuBar->super___shared_ptr<gui::MenuBar,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              onMenuItemClick,menuItemClick);
  return;
}

Assistant:

void connectDebugSignals(const std::shared_ptr<gui::MenuBar>& menuBar, const std::string& name) {
    connectDebugSignals(std::dynamic_pointer_cast<gui::Widget>(menuBar), name);
    menuBar->onMousePress.connect(mousePress);
    menuBar->onMouseRelease.connect(mouseRelease);
    menuBar->onClick.connect(click);
    menuBar->onMenuItemClick.connect(menuItemClick);
}